

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_types.hpp
# Opt level: O0

void __thiscall boost::unique_lock<boost::mutex>::lock(unique_lock<boost::mutex> *this)

{
  bool bVar1;
  unique_lock<boost::mutex> *in_RDI;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int ev;
  char local_98 [56];
  mutex *in_stack_ffffffffffffffa0;
  undefined1 local_48 [8];
  lock_error *in_stack_ffffffffffffffc0;
  
  ev = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (in_RDI->m == (mutex *)0x0) {
    lock_error::lock_error
              ((lock_error *)in_RDI,(int)((ulong)local_48 >> 0x20),in_stack_ffffffffffffff50);
    throw_exception<boost::lock_error>(in_stack_ffffffffffffffc0);
  }
  bVar1 = owns_lock(in_RDI);
  if (!bVar1) {
    mutex::lock(in_stack_ffffffffffffffa0);
    in_RDI->is_locked = true;
    return;
  }
  lock_error::lock_error((lock_error *)in_RDI,ev,local_98);
  throw_exception<boost::lock_error>(in_stack_ffffffffffffffc0);
}

Assistant:

void lock()
    {
      if (m == 0)
      {
        boost::throw_exception(
            boost::lock_error(static_cast<int>(system::errc::operation_not_permitted), "boost unique_lock has no mutex"));
      }
      if (owns_lock())
      {
        boost::throw_exception(
            boost::lock_error(static_cast<int>(system::errc::resource_deadlock_would_occur), "boost unique_lock owns already the mutex"));
      }
      m->lock();
      is_locked = true;
    }